

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  XmlOutput *pXVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f40;
  xml_output local_f28;
  xml_output local_ef0;
  xml_output local_eb8;
  xml_output local_e80;
  xml_output local_e48;
  xml_output local_e10;
  xml_output local_dd8;
  xml_output local_da0;
  xml_output local_d68;
  xml_output local_d30;
  xml_output local_cf8;
  xml_output local_cc0;
  xml_output local_c88;
  xml_output local_c50;
  xml_output local_c18;
  xml_output local_be0;
  xml_output local_ba8;
  xml_output local_b70;
  QArrayDataPointer<char16_t> local_b38;
  xml_output local_b20;
  xml_output local_ae8;
  xml_output local_ab0;
  xml_output local_a78;
  xml_output local_a40;
  xml_output local_a08;
  xml_output local_9d0;
  xml_output local_998;
  xml_output local_960;
  xml_output local_928;
  xml_output local_8f0;
  xml_output local_8b8;
  xml_output local_880;
  xml_output local_848;
  xml_output local_810;
  xml_output local_7d8;
  xml_output local_7a0;
  xml_output local_768;
  xml_output local_730;
  xml_output local_6f8;
  xml_output local_6c0;
  xml_output local_688;
  xml_output local_650;
  xml_output local_618;
  xml_output local_5e0;
  xml_output local_5a8;
  xml_output local_570;
  xml_output local_538;
  xml_output local_500;
  xml_output local_4c8;
  xml_output local_490;
  xml_output local_458;
  xml_output local_420;
  xml_output local_3e8;
  xml_output local_3b0;
  xml_output local_378;
  xml_output local_340;
  xml_output local_308;
  xml_output local_2d0;
  xml_output local_298;
  xml_output local_260;
  xml_output local_228;
  xml_output local_1f0;
  xml_output local_1b8;
  xml_output local_180;
  xml_output local_148;
  xml_output local_110;
  QArrayDataPointer<char16_t> local_d8;
  xml_output local_c0;
  QArrayDataPointer<char16_t> local_88;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_88,"Tool");
  tag(&local_70,(QString *)&local_88);
  pXVar2 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QString::QString((QString *)&local_d8,"VCCLCompilerTool");
  attrS(&local_c0,"Name",(QString *)&local_d8);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_c0);
  attrX(&local_110,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_110);
  attrX(&local_148,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_148);
  attrX(&local_180,"AdditionalUsingDirectories",(QStringList *)((long)__buf + 0x38),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_180);
  attrS(&local_1b8,"AssemblerListingLocation",(QString *)((long)__buf + 0x50));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_1b8);
  attrE(&local_1f0,"AssemblerOutput",*(int *)((long)__buf + 0x68),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_1f0);
  attrE(&local_228,"BasicRuntimeChecks",*(int *)((long)__buf + 0x6c),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_228);
  attrE(&local_260,"BrowseInformation",*(int *)((long)__buf + 0x70),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_260);
  attrS(&local_298,"BrowseInformationFile",(QString *)((long)__buf + 0x78));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_298);
  attrT(&local_2d0,"BufferSecurityCheck",*(triState *)((long)__buf + 0x90));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_2d0);
  attrE(&local_308,"CallingConvention",*(int *)((long)__buf + 0x94),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_308);
  attrE(&local_340,"CompileAs",*(int *)((long)__buf + 0x98),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_340);
  attrE(&local_378,"CompileAsManaged",*(int *)((long)__buf + 0x9c),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_378);
  attrT(&local_3b0,"CompileOnly",*(triState *)((long)__buf + 0xa4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_3b0);
  attrE(&local_3e8,"DebugInformationFormat",*(int *)((long)__buf + 0xa8),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_3e8);
  attrT(&local_420,"Detect64BitPortabilityProblems",*(triState *)((long)__buf + 0xb0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_420);
  attrT(&local_458,"DisableLanguageExtensions",*(triState *)((long)__buf + 0xb4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_458);
  attrX(&local_490,"DisableSpecificWarnings",(QStringList *)((long)__buf + 0xb8),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_490);
  attrE(&local_4c8,"EnableEnhancedInstructionSet",*(int *)((long)__buf + 0xd0),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_4c8);
  attrT(&local_500,"EnableFiberSafeOptimizations",*(triState *)((long)__buf + 0xd4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_500);
  attrT(&local_538,"EnableFunctionLevelLinking",*(triState *)((long)__buf + 0xd8));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_538);
  attrT(&local_570,"EnableIntrinsicFunctions",*(triState *)((long)__buf + 0xdc));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_570);
  xformExceptionHandlingNET2005
            (&local_5a8,*(exceptionHandling *)((long)__buf + 0xe0),
             *(DotNET *)(*(long *)((long)__buf + 0x318) + 4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_5a8);
  attrT(&local_5e0,"ExpandAttributedSource",*(triState *)((long)__buf + 0xe4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_5e0);
  attrE(&local_618,"FavorSizeOrSpeed",*(int *)((long)__buf + 0xe8),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_618);
  attrE(&local_650,"FloatingPointModel",*(int *)((long)__buf + 0xec),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_650);
  attrT(&local_688,"FloatingPointExceptions",*(triState *)((long)__buf + 0xf0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_688);
  attrT(&local_6c0,"ForceConformanceInForLoopScope",*(triState *)((long)__buf + 0xf4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_6c0);
  attrX(&local_6f8,"ForcedIncludeFiles",(QStringList *)((long)__buf + 0xf8),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_6f8);
  attrX(&local_730,"ForcedUsingFiles",(QStringList *)((long)__buf + 0x110),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_730);
  attrE(&local_768,"GeneratePreprocessedFile",*(int *)((long)__buf + 0x128),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_768);
  attrT(&local_7a0,"GlobalOptimizations",*(triState *)((long)__buf + 0x130));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_7a0);
  attrT(&local_7d8,"IgnoreStandardIncludePath",*(triState *)((long)__buf + 0x134));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_7d8);
  attrT(&local_810,"ImproveFloatingPointConsistency",*(triState *)((long)__buf + 0x138));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_810);
  attrE(&local_848,"InlineFunctionExpansion",*(int *)((long)__buf + 0x13c),3);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_848);
  attrT(&local_880,"KeepComments",*(triState *)((long)__buf + 0x140));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_880);
  attrT(&local_8b8,"MinimalRebuild",*(triState *)((long)__buf + 0x178));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_8b8);
  attrS(&local_8f0,"ObjectFile",(QString *)((long)__buf + 0x180));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_8f0);
  attrT(&local_928,"OmitFramePointers",*(triState *)((long)__buf + 0x19c));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_928);
  attrT(&local_960,"OpenMP",*(triState *)((long)__buf + 0x1a0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_960);
  attrE(&local_998,"Optimization ",*(int *)((long)__buf + 0x1a4),5);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_998);
  attrE(&local_9d0,"OptimizeForProcessor",*(int *)((long)__buf + 0x1a8),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_9d0);
  attrT(&local_a08,"OptimizeForWindowsApplication",*(triState *)((long)__buf + 0x1ac));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_a08);
  attrS(&local_a40,"OutputFile",(QString *)((long)__buf + 0x1b0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_a40);
  attrS(&local_a78,"PrecompiledHeaderFile",(QString *)((long)__buf + 0x1c8));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_a78);
  attrS(&local_ab0,"PrecompiledHeaderThrough",(QString *)((long)__buf + 0x1e0));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_ab0);
  attrX(&local_ae8,"PreprocessorDefinitions",(QStringList *)((long)__buf + 0x1f8),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_ae8);
  lVar1 = *(long *)((long)__buf + 0x218);
  if (lVar1 == 0) {
    noxml();
  }
  else {
    QString::QString((QString *)&local_b38,"ProgramDataBaseFileName");
    attribute(&local_b20,(QString *)&local_b38,(QString *)((long)__buf + 0x210));
  }
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_b20);
  attrE(&local_b70,"RuntimeLibrary",*(int *)((long)__buf + 0x228),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_b70);
  attrT(&local_ba8,"RuntimeTypeInfo",*(triState *)((long)__buf + 0x22c));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_ba8);
  attrT(&local_be0,"ShowIncludes",*(triState *)((long)__buf + 0x230));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_be0);
  attrT(&local_c18,"SmallerTypeCheck",*(triState *)((long)__buf + 0x234));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_c18);
  attrT(&local_c50,"StringPooling",*(triState *)((long)__buf + 0x238));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_c50);
  attrE(&local_c88,"StructMemberAlignment",*(int *)((long)__buf + 0x23c),0);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_c88);
  attrT(&local_cc0,"SuppressStartupBanner",*(triState *)((long)__buf + 0x240));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_cc0);
  attrT(&local_cf8,"TreatWChar_tAsBuiltInType",*(triState *)((long)__buf + 0x244));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_cf8);
  attrT(&local_d30,"TurnOffAssemblyGeneration",*(triState *)((long)__buf + 0x248));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_d30);
  attrT(&local_d68,"UndefineAllPreprocessorDefinitions",*(triState *)((long)__buf + 0x24c));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_d68);
  attrX(&local_da0,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x250),",");
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_da0);
  xformUsePrecompiledHeaderForNET2005
            (&local_dd8,*(pchOption *)((long)__buf + 0x268),
             *(DotNET *)(*(long *)((long)__buf + 0x318) + 4));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_dd8);
  attrT(&local_e10,"WarnAsError",*(triState *)((long)__buf + 0x288));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_e10);
  attrE(&local_e48,"WarningLevel",*(int *)((long)__buf + 0x28c),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_e48);
  attrT(&local_e80,"WholeProgramOptimization",*(triState *)((long)__buf + 0x290));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_e80);
  attrE(&local_eb8,"CompileForArchitecture",*(int *)((long)__buf + 0x294),-1);
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_eb8);
  attrT(&local_ef0,"InterworkCalls",*(triState *)((long)__buf + 0x298));
  pXVar2 = XmlOutput::operator<<(pXVar2,&local_ef0);
  QString::QString((QString *)&local_f40,"Tool");
  closetag(&local_f28,(QString *)&local_f40);
  XmlOutput::operator<<(pXVar2,&local_f28);
  XmlOutput::xml_output::~xml_output(&local_f28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f40);
  XmlOutput::xml_output::~xml_output(&local_ef0);
  XmlOutput::xml_output::~xml_output(&local_eb8);
  XmlOutput::xml_output::~xml_output(&local_e80);
  XmlOutput::xml_output::~xml_output(&local_e48);
  XmlOutput::xml_output::~xml_output(&local_e10);
  XmlOutput::xml_output::~xml_output(&local_dd8);
  XmlOutput::xml_output::~xml_output(&local_da0);
  XmlOutput::xml_output::~xml_output(&local_d68);
  XmlOutput::xml_output::~xml_output(&local_d30);
  XmlOutput::xml_output::~xml_output(&local_cf8);
  XmlOutput::xml_output::~xml_output(&local_cc0);
  XmlOutput::xml_output::~xml_output(&local_c88);
  XmlOutput::xml_output::~xml_output(&local_c50);
  XmlOutput::xml_output::~xml_output(&local_c18);
  XmlOutput::xml_output::~xml_output(&local_be0);
  XmlOutput::xml_output::~xml_output(&local_ba8);
  XmlOutput::xml_output::~xml_output(&local_b70);
  XmlOutput::xml_output::~xml_output(&local_b20);
  if (lVar1 != 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b38);
  }
  XmlOutput::xml_output::~xml_output(&local_ae8);
  XmlOutput::xml_output::~xml_output(&local_ab0);
  XmlOutput::xml_output::~xml_output(&local_a78);
  XmlOutput::xml_output::~xml_output(&local_a40);
  XmlOutput::xml_output::~xml_output(&local_a08);
  XmlOutput::xml_output::~xml_output(&local_9d0);
  XmlOutput::xml_output::~xml_output(&local_998);
  XmlOutput::xml_output::~xml_output(&local_960);
  XmlOutput::xml_output::~xml_output(&local_928);
  XmlOutput::xml_output::~xml_output(&local_8f0);
  XmlOutput::xml_output::~xml_output(&local_8b8);
  XmlOutput::xml_output::~xml_output(&local_880);
  XmlOutput::xml_output::~xml_output(&local_848);
  XmlOutput::xml_output::~xml_output(&local_810);
  XmlOutput::xml_output::~xml_output(&local_7d8);
  XmlOutput::xml_output::~xml_output(&local_7a0);
  XmlOutput::xml_output::~xml_output(&local_768);
  XmlOutput::xml_output::~xml_output(&local_730);
  XmlOutput::xml_output::~xml_output(&local_6f8);
  XmlOutput::xml_output::~xml_output(&local_6c0);
  XmlOutput::xml_output::~xml_output(&local_688);
  XmlOutput::xml_output::~xml_output(&local_650);
  XmlOutput::xml_output::~xml_output(&local_618);
  XmlOutput::xml_output::~xml_output(&local_5e0);
  XmlOutput::xml_output::~xml_output(&local_5a8);
  XmlOutput::xml_output::~xml_output(&local_570);
  XmlOutput::xml_output::~xml_output(&local_538);
  XmlOutput::xml_output::~xml_output(&local_500);
  XmlOutput::xml_output::~xml_output(&local_4c8);
  XmlOutput::xml_output::~xml_output(&local_490);
  XmlOutput::xml_output::~xml_output(&local_458);
  XmlOutput::xml_output::~xml_output(&local_420);
  XmlOutput::xml_output::~xml_output(&local_3e8);
  XmlOutput::xml_output::~xml_output(&local_3b0);
  XmlOutput::xml_output::~xml_output(&local_378);
  XmlOutput::xml_output::~xml_output(&local_340);
  XmlOutput::xml_output::~xml_output(&local_308);
  XmlOutput::xml_output::~xml_output(&local_2d0);
  XmlOutput::xml_output::~xml_output(&local_298);
  XmlOutput::xml_output::~xml_output(&local_260);
  XmlOutput::xml_output::~xml_output(&local_228);
  XmlOutput::xml_output::~xml_output(&local_1f0);
  XmlOutput::xml_output::~xml_output(&local_1b8);
  XmlOutput::xml_output::~xml_output(&local_180);
  XmlOutput::xml_output::~xml_output(&local_148);
  XmlOutput::xml_output::~xml_output(&local_110);
  XmlOutput::xml_output::~xml_output(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCCLCompilerTool)
        << attrX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories)
        << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
        << attrX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories)
        << attrS(_AssemblerListingLocation, tool.AssemblerListingLocation)
        << attrE(_AssemblerOutput, tool.AssemblerOutput, /*ifNot*/ asmListingNone)
        << attrE(_BasicRuntimeChecks, tool.BasicRuntimeChecks, /*ifNot*/ runtimeBasicCheckNone)
        << attrE(_BrowseInformation, tool.BrowseInformation, /*ifNot*/ brInfoNone)
        << attrS(_BrowseInformationFile, tool.BrowseInformationFile)
        << attrT(_BufferSecurityCheck, tool.BufferSecurityCheck)
        << attrE(_CallingConvention, tool.CallingConvention, /*ifNot*/ callConventionDefault)
        << attrE(_CompileAs, tool.CompileAs, compileAsDefault)
        << attrE(_CompileAsManaged, tool.CompileAsManaged, /*ifNot*/ managedDefault)
        << attrT(_CompileOnly, tool.CompileOnly)
        << attrE(_DebugInformationFormat, tool.DebugInformationFormat, /*ifNot*/ debugUnknown)
        << attrT(_Detect64BitPortabilityProblems, tool.Detect64BitPortabilityProblems)
        << attrT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
        << attrX(_DisableSpecificWarnings, tool.DisableSpecificWarnings)
        << attrE(_EnableEnhancedInstructionSet, tool.EnableEnhancedInstructionSet, /*ifnot*/ archNotSet)
        << attrT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
        << attrT(_EnableFunctionLevelLinking, tool.EnableFunctionLevelLinking)
        << attrT(_EnableIntrinsicFunctions, tool.EnableIntrinsicFunctions)
        << xformExceptionHandlingNET2005(tool.ExceptionHandling, tool.config->CompilerVersion)
        << attrT(_ExpandAttributedSource, tool.ExpandAttributedSource)
        << attrE(_FavorSizeOrSpeed, tool.FavorSizeOrSpeed, /*ifNot*/ favorNone)

        << attrE(_FloatingPointModel, tool.FloatingPointModel, /*ifNot*/ floatingPointNotSet)
        << attrT(_FloatingPointExceptions, tool.FloatingPointExceptions)

        << attrT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
        << attrX(_ForcedIncludeFiles, tool.ForcedIncludeFiles)
        << attrX(_ForcedUsingFiles, tool.ForcedUsingFiles)
        << attrE(_GeneratePreprocessedFile, tool.GeneratePreprocessedFile, /*ifNot*/ preprocessUnknown)
        << attrT(_GlobalOptimizations, tool.GlobalOptimizations)
        << attrT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
        << attrT(_ImproveFloatingPointConsistency, tool.ImproveFloatingPointConsistency)
        << attrE(_InlineFunctionExpansion, tool.InlineFunctionExpansion, /*ifNot*/ expandDefault)
        << attrT(_KeepComments, tool.KeepComments)
        << attrT(_MinimalRebuild, tool.MinimalRebuild)
        << attrS(_ObjectFile, tool.ObjectFile)
        << attrT(_OmitFramePointers, tool.OmitFramePointers)
        << attrT(_OpenMP, tool.OpenMP)
        << attrE(_Optimization, tool.Optimization, /*ifNot*/ optimizeDefault)
        << attrE(_OptimizeForProcessor, tool.OptimizeForProcessor, /*ifNot*/ procOptimizeBlended)
        << attrT(_OptimizeForWindowsApplication, tool.OptimizeForWindowsApplication)
        << attrS(_OutputFile, tool.OutputFile)
        << attrS(_PrecompiledHeaderFile, tool.PrecompiledHeaderFile)
        << attrS(_PrecompiledHeaderThrough, tool.PrecompiledHeaderThrough)
        << attrX(_PreprocessorDefinitions, tool.PreprocessorDefinitions)
        << (tool.ProgramDataBaseFileName.isNull() ? noxml() : attr(_ProgramDataBaseFileName, tool.ProgramDataBaseFileName))
        << attrE(_RuntimeLibrary, tool.RuntimeLibrary, /*ifNot*/ rtUnknown)
        << attrT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
        << attrT(_ShowIncludes, tool.ShowIncludes)
        << attrT(_SmallerTypeCheck, tool.SmallerTypeCheck)
        << attrT(_StringPooling, tool.StringPooling)
        << attrE(_StructMemberAlignment, tool.StructMemberAlignment, /*ifNot*/ alignNotSet)
        << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << attrT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
        << attrT(_TurnOffAssemblyGeneration, tool.TurnOffAssemblyGeneration)
        << attrT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
        << attrX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions)
        << xformUsePrecompiledHeaderForNET2005(tool.UsePrecompiledHeader, tool.config->CompilerVersion)
        << attrT(_WarnAsError, tool.WarnAsError)
        << attrE(_WarningLevel, tool.WarningLevel, /*ifNot*/ warningLevelUnknown)
        << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization)
        << attrE(_CompileForArchitecture, tool.CompileForArchitecture, /*ifNot*/ archUnknown)
        << attrT(_InterworkCalls, tool.InterworkCalls)

        << closetag(_Tool);
}